

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store_array_text<embree::SceneGraph::QuadMeshNode::Quad>
          (XMLWriter *this,char *name,
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          *vec)

{
  ulong uVar1;
  size_type sVar2;
  int __oflag;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *in_RDX;
  char *in_RSI;
  XMLWriter *in_RDI;
  size_t i;
  Quad *in_stack_ffffffffffffff48;
  XMLWriter *in_stack_ffffffffffffff50;
  allocator local_79;
  string local_78 [32];
  ulong local_58;
  allocator local_39;
  string local_38 [32];
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RSI,&local_39);
  open(in_RDI,(char *)local_38,__oflag);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_58 = 0;
  while( true ) {
    uVar1 = local_58;
    sVar2 = std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::size(local_18);
    if (sVar2 <= uVar1) break;
    tab(in_stack_ffffffffffffff50);
    std::
    vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
    ::operator[](local_18,local_58);
    store_array_elt(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_58 = local_58 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_10,&local_79);
  close(in_RDI,(int)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const std::vector<T>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }